

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O1

void ncnn::dynamic_quantize_2d_per_h(Mat *blob,Mat *blob_int8,Mat *scales,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  int iVar7;
  void *pvVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  
  Mat::create(blob_int8,blob->w,blob->h,1,1,opt->workspace_allocator);
  Mat::create(scales,blob->h,4,1,opt->workspace_allocator);
  iVar1 = blob_int8->h;
  if (0 < (long)iVar1) {
    pvVar8 = blob->data;
    iVar2 = blob->w;
    uVar3 = blob_int8->w;
    pvVar4 = scales->data;
    sVar5 = blob->elemsize;
    lVar10 = 0;
    do {
      fVar12 = 0.0;
      if (0 < (int)uVar3) {
        uVar11 = 0;
        do {
          fVar13 = ABS(*(float *)((long)pvVar8 + uVar11 * 4));
          if (fVar12 <= fVar13) {
            fVar12 = fVar13;
          }
          uVar11 = uVar11 + 1;
        } while (uVar3 != uVar11);
      }
      *(uint *)((long)pvVar4 + lVar10 * 4) =
           -(uint)(fVar12 == 0.0) & 0x3f800000 | ~-(uint)(fVar12 == 0.0) & (uint)(127.0 / fVar12);
      lVar10 = lVar10 + 1;
      pvVar8 = (void *)((long)pvVar8 + (long)iVar2 * sVar5);
    } while (lVar10 != iVar1);
  }
  if (0 < blob_int8->h) {
    lVar10 = 0;
    do {
      iVar1 = blob_int8->w;
      if (0 < (long)iVar1) {
        iVar2 = blob->w;
        fVar12 = *(float *)((long)scales->data + lVar10 * 4);
        sVar5 = blob_int8->elemsize;
        pvVar8 = blob_int8->data;
        sVar6 = blob->elemsize;
        pvVar4 = blob->data;
        lVar9 = 0;
        do {
          fVar13 = roundf(*(float *)((long)pvVar4 + lVar9 * 4 + sVar6 * lVar10 * (long)iVar2) *
                          fVar12);
          iVar7 = (int)fVar13;
          if (iVar7 < -0x7e) {
            iVar7 = -0x7f;
          }
          if (0x7e < iVar7) {
            iVar7 = 0x7f;
          }
          *(char *)((long)pvVar8 + lVar9 + sVar5 * lVar10 * (long)iVar1) = (char)iVar7;
          lVar9 = lVar9 + 1;
        } while (lVar9 < blob_int8->w);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < blob_int8->h);
  }
  return;
}

Assistant:

static void dynamic_quantize_2d_per_h(const Mat& blob, Mat& blob_int8, Mat& scales, const Option& opt)
{
    blob_int8.create(blob.w, blob.h, (size_t)1u, 1, opt.workspace_allocator);
    scales.create(blob.h, (size_t)4u, 1, opt.workspace_allocator);

    for (int i = 0; i < blob_int8.h; i++)
    {
        const float* ptr = blob.row(i);

        float absmax = 0.f;
        for (int j = 0; j < blob_int8.w; j++)
        {
            absmax = std::max(absmax, (float)fabs(ptr[j]));
        }

        scales[i] = absmax == 0.f ? 1.f : 127.f / absmax;
    }

    for (int i = 0; i < blob_int8.h; i++)
    {
        const float* ptr = blob.row(i);
        signed char* outptr = blob_int8.row<signed char>(i);
        const float scale = scales[i];

        for (int j = 0; j < blob_int8.w; j++)
        {
            outptr[j] = float2int8(ptr[j] * scale);
        }
    }
}